

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O3

bool __thiscall
ON_3dPointArray::GetClosestPoint
          (ON_3dPointArray *this,ON_3dPoint P,int *closest_point_index,double maximum_distance)

{
  bool bVar1;
  double dVar2;
  int local_1c;
  double local_18;
  
  local_18 = maximum_distance;
  bVar1 = ON_GetClosestPointInPointList
                    ((this->super_ON_SimpleArray<ON_3dPoint>).m_count,
                     (this->super_ON_SimpleArray<ON_3dPoint>).m_a,P,&local_1c);
  if (bVar1) {
    if (0.0 < local_18) {
      dVar2 = ON_3dPoint::DistanceTo(&P,(this->super_ON_SimpleArray<ON_3dPoint>).m_a + local_1c);
      if (local_18 < dVar2) goto LAB_00582ae8;
    }
    bVar1 = true;
    if (closest_point_index != (int *)0x0) {
      *closest_point_index = local_1c;
    }
  }
  else {
LAB_00582ae8:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_3dPointArray::GetClosestPoint( 
          ON_3dPoint P,
          int* closest_point_index,
          double maximum_distance
          ) const
{
  int i;

  bool rc = ON_GetClosestPointInPointList( m_count, m_a , P, &i );

  if (rc)
  {
    if ( maximum_distance > 0.0 && P.DistanceTo(m_a[i]) > maximum_distance )
    {
      rc = false;
    }
    else if ( closest_point_index )
    {
      *closest_point_index = i;
    }
  }

  return rc;
}